

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxSwitchStatement::Resolve(FxSwitchStatement *this,FCompileContext *ctx)

{
  uint *puVar1;
  BYTE BVar2;
  uint uVar3;
  FxExpression *pFVar4;
  PString *pPVar5;
  _func_int **pp_Var6;
  CaseAddr *pCVar7;
  int iVar8;
  undefined4 extraout_var;
  FxIntCast *this_00;
  FxExpression *pFVar9;
  long lVar10;
  FxExpression **ppFVar11;
  long *plVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  FScriptPosition *pFVar17;
  ulong uVar18;
  ulong uVar19;
  FString local_40;
  FScriptPosition *local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Condition != (FxExpression *)0x0) {
    iVar8 = (*this->Condition->_vptr_FxExpression[2])();
    pFVar9 = (FxExpression *)CONCAT44(extraout_var,iVar8);
    this->Condition = pFVar9;
    if (pFVar9 != (FxExpression *)0x0) {
      if (pFVar9->ValueType != (PType *)TypeName) {
        this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar9 = this->Condition;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,&pFVar9->ScriptPosition);
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_IntCast;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070b5b0;
        this_00->basex = pFVar9;
        (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
        this_00->NoWarn = false;
        this_00->Explicit = false;
        this->Condition = (FxExpression *)this_00;
        pFVar9 = FxIntCast::Resolve(this_00,ctx);
        this->Condition = pFVar9;
        if (pFVar9 == (FxExpression *)0x0) goto LAB_00536c61;
      }
      uVar18 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
      if (uVar18 == 0) {
        pFVar17 = &(this->super_FxExpression).ScriptPosition;
        FScriptPosition::Message(pFVar17,0,"Empty switch statement");
        iVar8 = (*this->Condition->_vptr_FxExpression[3])();
        if ((char)iVar8 == '\0') {
          pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
          pFVar9 = this->Condition;
          this->Condition = (FxExpression *)0x0;
          (*pp_Var6[1])(this);
          pFVar9->NeedResult = false;
          return pFVar9;
        }
        pFVar9 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
        pFVar9->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      }
      else {
        pFVar9 = ctx->ControlStmt;
        ctx->ControlStmt = &this->super_FxExpression;
        ppFVar11 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
        lVar16 = 0;
        do {
          plVar12 = *(long **)((long)ppFVar11 + lVar16);
          if (plVar12 == (long *)0x0) goto LAB_00536c61;
          lVar10 = (**(code **)(*plVar12 + 0x10))();
          *(long *)((long)ppFVar11 + lVar16) = lVar10;
          if (lVar10 == 0) goto LAB_00536c61;
          *(undefined1 *)(lVar10 + 0x21) = 0;
          lVar16 = lVar16 + 8;
        } while (uVar18 << 3 != lVar16);
        pFVar4 = this->Condition;
        ctx->ControlStmt = pFVar9;
        iVar8 = (*pFVar4->_vptr_FxExpression[3])();
        if ((char)iVar8 == '\0') {
          uVar18 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
          if (uVar18 == 0) {
            return &this->super_FxExpression;
          }
          ppFVar11 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
          lVar16 = 0;
          do {
            lVar10 = *(long *)((long)ppFVar11 + lVar16);
            if ((*(int *)(lVar10 + 0x24) == 0x3d) && (*(long *)(lVar10 + 0x28) != 0)) {
              iVar8 = *(int *)(lVar10 + 0x30);
              TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::Grow
                        (&this->CaseAddresses,1);
              pCVar7 = (this->CaseAddresses).Array;
              uVar3 = (this->CaseAddresses).Count;
              pCVar7[uVar3].casevalue = iVar8;
              pCVar7[uVar3].jumpaddress = 0;
              puVar1 = &(this->CaseAddresses).Count;
              *puVar1 = *puVar1 + 1;
            }
            lVar16 = lVar16 + 8;
          } while (uVar18 << 3 != lVar16);
          return &this->super_FxExpression;
        }
        local_38 = &(this->super_FxExpression).ScriptPosition;
        FScriptPosition::Message(local_38,0,"Case expression is constant");
        if ((this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
          iVar14 = -1;
          iVar13 = -1;
          uVar18 = 0xffffffff;
          iVar8 = -1;
        }
        else {
          ppFVar11 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
          uVar19 = 0xffffffff;
          uVar18 = 0;
          iVar13 = -1;
          iVar14 = -1;
          do {
            pFVar9 = ppFVar11[uVar18];
            if (pFVar9 != (FxExpression *)0x0) {
              if (pFVar9->ExprType == EFX_CaseStatement) {
                if (pFVar9[1]._vptr_FxExpression == (_func_int **)0x0) {
                  uVar19 = uVar18 & 0xffffffff;
                }
                else {
                  iVar8 = *(int *)&pFVar9[1].ScriptPosition.FileName.Chars;
                  pPVar5 = (PString *)this->Condition[1]._vptr_FxExpression;
                  pFVar17 = &this->Condition[1].ScriptPosition;
                  if (pPVar5 == TypeString) {
                    FString::AttachToOther(&local_40,&pFVar17->FileName);
                  }
                  else {
                    local_40.Chars = (pFVar17->FileName).Chars;
                  }
                  BVar2 = (pPVar5->super_PBasicType).super_PType.RegType;
                  if (BVar2 == '\x01') {
                    iVar15 = (int)(double)local_40.Chars;
                  }
                  else {
                    iVar15 = 0;
                    if (BVar2 == '\0') {
                      iVar15 = (int)local_40.Chars;
                    }
                  }
                  if (pPVar5 == TypeString) {
                    FString::~FString(&local_40);
                  }
                  if (iVar8 == iVar15) {
                    iVar13 = (int)uVar18;
                  }
                  pp_Var6 = pFVar9[1]._vptr_FxExpression;
                  if ((pp_Var6 != (_func_int **)0x0) &&
                     ((PType *)pp_Var6[3] != this->Condition->ValueType)) {
                    FScriptPosition::Message
                              ((FScriptPosition *)(pp_Var6 + 1),2,"Type mismatch in case statement")
                    ;
                    goto LAB_00536c61;
                  }
                }
              }
              iVar8 = (int)uVar19;
              ppFVar11 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
              if ((ppFVar11[uVar18]->ExprType == EFX_JumpStatement) &&
                 (*(int *)&ppFVar11[uVar18][1]._vptr_FxExpression == 0x126)) {
                iVar15 = (int)uVar18;
                if (-1 < iVar14) {
                  iVar15 = iVar14;
                }
                if (-1 < iVar8) {
                  iVar14 = iVar15;
                }
                if (-1 < iVar13) goto LAB_00536af6;
              }
            }
            iVar8 = (int)uVar19;
            uVar18 = uVar18 + 1;
          } while (uVar18 < (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count);
          uVar18 = 0xffffffff;
        }
LAB_00536af6:
        if (-1 < iVar13) {
          iVar14 = (int)uVar18;
          iVar8 = iVar13;
        }
        if ((0 < iVar8) && (1 < iVar14 - iVar8)) {
          plVar12 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
          *plVar12 = (long)&PTR__FxExpression_0070d370;
          FScriptPosition::FScriptPosition((FScriptPosition *)(plVar12 + 1),local_38);
          plVar12[3] = 0;
          *(undefined2 *)(plVar12 + 4) = 0x100;
          *(undefined4 *)((long)plVar12 + 0x24) = 0x2b;
          *plVar12 = (long)&PTR__FxSequence_0070d500;
          plVar12[5] = 0;
          plVar12[6] = 0;
          uVar18 = (ulong)(iVar8 + 1U);
          if ((int)(iVar8 + 1U) < iVar14) {
            do {
              pFVar9 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar18];
              if ((pFVar9 != (FxExpression *)0x0) && (pFVar9->ExprType != EFX_CaseStatement)) {
                TArray<FxExpression_*,_FxExpression_*>::Grow
                          ((TArray<FxExpression_*,_FxExpression_*> *)(plVar12 + 5),1);
                uVar3 = *(uint *)((long)plVar12 + 0x34);
                *(FxExpression **)(plVar12[5] + (ulong)uVar3 * 8) = pFVar9;
                *(uint *)((long)plVar12 + 0x34) = uVar3 + 1;
                pFVar9->NeedResult = false;
                (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar18] =
                     (FxExpression *)0x0;
              }
              uVar18 = uVar18 + 1;
            } while ((int)uVar18 < iVar14);
          }
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          pFVar9 = (FxExpression *)(**(code **)(*plVar12 + 0x10))(plVar12,ctx);
          return pFVar9;
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar9 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
        pFVar9->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
        pFVar17 = local_38;
      }
      FScriptPosition::FScriptPosition(&pFVar9->ScriptPosition,pFVar17);
      pFVar9->ValueType = (PType *)0x0;
      pFVar9->ExprType = EFX_Nop;
      pFVar9->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070de78;
      pFVar9->isresolved = true;
      pFVar9->NeedResult = true;
      return pFVar9;
    }
  }
LAB_00536c61:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxSwitchStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeName)
	{
		Condition = new FxIntCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Content.Size() == 0)
	{
		ScriptPosition.Message(MSG_WARNING, "Empty switch statement");
		if (Condition->isConstant())
		{
			return new FxNop(ScriptPosition);
		}
		else
		{
			// The condition may have a side effect so it should be processed (possible to-do: Analyze all nodes in there and delete if not.)
			auto x = Condition;
			Condition = nullptr;
			delete this;
			x->NeedResult = false;
			return x;
		}
	}

	auto outerctrl = ctx.ControlStmt;
	ctx.ControlStmt = this;

	for (auto &line : Content)
	{
		SAFE_RESOLVE(line, ctx);
		line->NeedResult = false;
	}
	ctx.ControlStmt = outerctrl;

	if (Condition->isConstant())
	{
		ScriptPosition.Message(MSG_WARNING, "Case expression is constant");
		auto &content = Content;
		int defaultindex = -1;
		int defaultbreak = -1;
		int caseindex = -1;
		int casebreak = -1;
		// look for a case label with a matching value
		for (unsigned i = 0; i < content.Size(); i++)
		{
			if (content[i] != nullptr)
			{
				if (content[i]->ExprType == EFX_CaseStatement)
				{
					auto casestmt = static_cast<FxCaseStatement *>(content[i]);
					if (casestmt->Condition == nullptr) defaultindex = i;
					else if (casestmt->CaseValue == static_cast<FxConstant *>(Condition)->GetValue().GetInt()) caseindex = i;
					if (casestmt->Condition && casestmt->Condition->ValueType != Condition->ValueType)
					{
						casestmt->Condition->ScriptPosition.Message(MSG_ERROR, "Type mismatch in case statement");
						delete this;
						return nullptr;
					}
				}
				if (content[i]->ExprType == EFX_JumpStatement && static_cast<FxJumpStatement *>(content[i])->Token == TK_Break)
				{
					if (defaultindex >= 0 && defaultbreak < 0) defaultbreak = i;
					if (caseindex >= 0 && casebreak < 0)
					{
						casebreak = i;
						break;	// when we find this we do not need to look any further.
					}
				}
			}
		}
		if (caseindex < 0)
		{
			caseindex = defaultindex;
			casebreak = defaultbreak;
		}
		if (caseindex > 0 && casebreak - caseindex > 1)
		{
			auto seq = new FxSequence(ScriptPosition);
			for (int i = caseindex + 1; i < casebreak; i++)
			{
				if (content[i] != nullptr && content[i]->ExprType != EFX_CaseStatement)
				{
					seq->Add(content[i]);
					content[i] = nullptr;
				}
			}
			delete this;
			return seq->Resolve(ctx);
		}
		delete this;
		return new FxNop(ScriptPosition);
	}

	int mincase = INT_MAX;
	int maxcase = INT_MIN;
	for (auto line : Content)
	{
		if (line->ExprType == EFX_CaseStatement)
		{
			auto casestmt = static_cast<FxCaseStatement *>(line);
			if (casestmt->Condition != nullptr)
			{
				CaseAddr ca = { casestmt->CaseValue, 0 };
				CaseAddresses.Push(ca);
				if (ca.casevalue < mincase) mincase = ca.casevalue;
				if (ca.casevalue > maxcase) maxcase = ca.casevalue;
			}
		}
	}
	return this;
}